

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O2

void __thiscall DBOPL::change_waveform(DBOPL *this,Bitu regbase,op_type *op_pt)

{
  Bitu BVar1;
  
  BVar1 = regbase - 0xea;
  if (regbase < 0x100) {
    BVar1 = regbase;
  }
  op_pt->cur_wmask = wavemask[this->wave_sel[BVar1]];
  op_pt->cur_wform = wavtable + waveform[this->wave_sel[BVar1]];
  return;
}

Assistant:

void DBOPL::change_waveform(Bitu regbase, op_type* op_pt) {
#if defined(OPLTYPE_IS_OPL3)
	if (regbase>=ARC_SECONDSET) regbase -= (ARC_SECONDSET-22);	// second set starts at 22
#endif
	// waveform selection
	op_pt->cur_wmask = wavemask[wave_sel[regbase]];
	op_pt->cur_wform = &wavtable[waveform[wave_sel[regbase]]];
	// (might need to be adapted to waveform type here...)
}